

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O3

void test_linear_hash_bucket_map_head_updates(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  linear_hash_table_t *linear_hash;
  ion_fpos_t iVar2;
  int iVar3;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  
  linear_hash = (linear_hash_table_t *)malloc(0x78);
  test_linear_hash_create(tc,linear_hash,key_type_numeric_signed,4,4,4);
  local_2c = 0;
  local_30 = 0x13;
  test_linear_hash_insert(tc,&local_2c,&local_30,'\0',1,'\x01',linear_hash);
  iVar2 = array_list_get(0,linear_hash->bucket_map);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2 == 0),0xf6,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    if (0 < linear_hash->records_per_bucket) {
      iVar3 = 0;
      do {
        local_34 = 0;
        local_38 = 0x13;
        test_linear_hash_insert(tc,&local_34,&local_38,'\0',1,'\x01',linear_hash);
        iVar3 = iVar3 + 1;
      } while (iVar3 < linear_hash->records_per_bucket);
    }
    iVar2 = array_list_get(0,linear_hash->bucket_map);
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2 != 0),0x100,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      iVar3 = fseek((FILE *)linear_hash->database,
                    (long)~((linear_hash->super).record.value_size +
                           (linear_hash->super).record.key_size) * 4 + -0x10,2);
      iVar2 = array_list_get(0,linear_hash->bucket_map);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar2 != iVar3),0x106,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        test_linear_hash_destroy(tc,linear_hash);
        return;
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_linear_hash_bucket_map_head_updates(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	ion_fpos_t expected_bucket_head = 0;

	/* base case -- assuming bucket 0 is inserted to */
	test_linear_hash_insert(tc, IONIZE(0, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_head == array_list_get(0, linear_hash->bucket_map));

	/* fill bucket 0 and cause the generation of an overflow */
	int i;

	for (i = 0; i < linear_hash->records_per_bucket; i++) {
		test_linear_hash_insert(tc, IONIZE(0, int), IONIZE(19, int), err_ok, 1, boolean_true, linear_hash);
	}

	/* test that the head of 0 index bucket linked list in the bucket map has changed */
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_head != array_list_get(0, linear_hash->bucket_map));

	ion_fpos_t total_record_size = linear_hash->super.record.key_size + linear_hash->super.record.value_size + sizeof(ion_byte_t);

	/* test that the new head of 0 index bucket is at the correct location */
	expected_bucket_head = fseek(linear_hash->database, -4 * total_record_size - sizeof(linear_hash_bucket_t), SEEK_END);
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_head != array_list_get(0, linear_hash->bucket_map));

	test_linear_hash_takedown(tc, linear_hash);
}